

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hts.c
# Opt level: O3

void hts_idx_destroy(hts_idx_t *idx)

{
  bidx_t *__ptr;
  khint_t kVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  long lVar5;
  
  if (idx != (hts_idx_t *)0x0) {
    if (idx->fmt != 3) {
      if (0 < idx->m) {
        lVar5 = 0;
        do {
          __ptr = idx->bidx[lVar5];
          free(idx->lidx[lVar5].offset);
          if (__ptr != (bidx_t *)0x0) {
            kVar1 = __ptr->n_buckets;
            if (kVar1 != 0) {
              bVar2 = 0;
              uVar4 = 0;
              do {
                if ((__ptr->flags[uVar4 >> 4] >> (bVar2 & 0x1e) & 3) == 0) {
                  free(__ptr->vals[uVar4].list);
                  kVar1 = __ptr->n_buckets;
                }
                uVar3 = (int)uVar4 + 1;
                uVar4 = (ulong)uVar3;
                bVar2 = bVar2 + 2;
              } while (uVar3 != kVar1);
            }
            free(__ptr->keys);
            free(__ptr->flags);
            free(__ptr->vals);
            free(__ptr);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < idx->m);
      }
      free(idx->bidx);
      free(idx->lidx);
      free(idx->meta);
    }
    free(idx);
    return;
  }
  return;
}

Assistant:

void hts_idx_destroy(hts_idx_t *idx)
{
    khint_t k;
    int i;
    if (idx == 0) return;
    // For HTS_FMT_CRAI, idx actually points to a different type -- see sam.c
    if (idx->fmt == HTS_FMT_CRAI) { free(idx); return; }

    for (i = 0; i < idx->m; ++i) {
        bidx_t *bidx = idx->bidx[i];
        free(idx->lidx[i].offset);
        if (bidx == 0) continue;
        for (k = kh_begin(bidx); k != kh_end(bidx); ++k)
            if (kh_exist(bidx, k))
                free(kh_value(bidx, k).list);
        kh_destroy(bin, bidx);
    }
    free(idx->bidx); free(idx->lidx); free(idx->meta);
    free(idx);
}